

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

int __thiscall
luna::Lexer::LexNumberXFractional
          (Lexer *this,TokenDetail *detail,bool integer_part,bool point,
          function<bool_(int)> *is_number_char,function<bool_(int)> *is_exponent)

{
  string *args_1;
  String *pSVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  LexException *this_00;
  undefined7 in_register_00000009;
  anon_union_16_2_eed97686_for_String_2 *paVar5;
  char cVar6;
  double dVar7;
  int local_4c;
  undefined4 local_48;
  int local_44;
  TokenDetail *local_40;
  _Any_data *local_38;
  
  local_48 = (undefined4)CONCAT71(in_register_00000009,point);
  local_4c = this->current_;
  local_40 = detail;
  local_38 = (_Any_data *)is_exponent;
  if ((is_number_char->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0014be57:
    std::__throw_bad_function_call();
  }
  args_1 = &this->token_buffer_;
  bVar2 = (*is_number_char->_M_invoker)((_Any_data *)is_number_char,&local_4c);
  cVar6 = (char)args_1;
  if (bVar2) {
    do {
      std::__cxx11::string::push_back(cVar6);
      local_4c = Next(this);
      this->current_ = local_4c;
      if ((is_number_char->super__Function_base)._M_manager == (_Manager_type)0x0)
      goto LAB_0014be57;
      bVar3 = (*is_number_char->_M_invoker)((_Any_data *)is_number_char,&local_4c);
    } while (bVar3);
  }
  if (((char)local_48 == '\x01' && !integer_part) && !bVar2) {
    this_00 = (LexException *)__cxa_allocate_exception(0x20);
    pSVar1 = this->module_;
    if ((pSVar1->super_GCObject).field_0x11 == '\0') {
      paVar5 = &pSVar1->field_1;
    }
    else {
      paVar5 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
    }
    LexException::LexException<char_const(&)[13]>
              (this_00,paVar5->str_buffer_,this->line_,this->column_,(char (*) [13])"unexpect \'.\'"
              );
  }
  else {
    if ((integer_part || (char)local_48 != '\0') || bVar2) {
      local_44 = this->current_;
      if (*(long *)(local_38 + 1) != 0) {
        bVar2 = (**(code **)((long)local_38 + 0x18))(local_38,&local_44);
        if (bVar2) {
          std::__cxx11::string::push_back(cVar6);
          iVar4 = Next(this);
          this->current_ = iVar4;
          if ((iVar4 == 0x2d) || (iVar4 == 0x2b)) {
            std::__cxx11::string::push_back(cVar6);
            iVar4 = Next(this);
            this->current_ = iVar4;
          }
          if (9 < this->current_ - 0x30U) {
            this_00 = (LexException *)__cxa_allocate_exception(0x20);
            pSVar1 = this->module_;
            if ((pSVar1->super_GCObject).field_0x11 == '\0') {
              paVar5 = &pSVar1->field_1;
            }
            else {
              paVar5 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
            }
            LexException::LexException<char_const(&)[24],std::__cxx11::string&,char_const(&)[2]>
                      (this_00,paVar5->str_buffer_,this->line_,this->column_,
                       (char (*) [24])"expect exponent after \'",args_1,(char (*) [2])0x169f0f);
            goto LAB_0014bf1e;
          }
          iVar4 = this->current_;
          while (iVar4 - 0x30U < 10) {
            std::__cxx11::string::push_back(cVar6);
            iVar4 = Next(this);
            this->current_ = iVar4;
          }
        }
        dVar7 = strtod((this->token_buffer_)._M_dataplus._M_p,(char **)0x0);
        (local_40->field_0).number_ = dVar7;
        local_40->token_ = 0x117;
        iVar4 = this->column_;
        local_40->line_ = this->line_;
        local_40->column_ = iVar4;
        local_40->module_ = this->module_;
        return 0x117;
      }
      goto LAB_0014be57;
    }
    this_00 = (LexException *)__cxa_allocate_exception(0x20);
    pSVar1 = this->module_;
    if ((pSVar1->super_GCObject).field_0x11 == '\0') {
      paVar5 = &pSVar1->field_1;
    }
    else {
      paVar5 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
    }
    LexException::LexException<char_const(&)[29],std::__cxx11::string&,char_const(&)[2]>
              (this_00,paVar5->str_buffer_,this->line_,this->column_,
               (char (*) [29])"unexpect incomplete number \'",args_1,(char (*) [2])0x169f0f);
  }
LAB_0014bf1e:
  __cxa_throw(this_00,&LexException::typeinfo,Exception::~Exception);
}

Assistant:

int Lexer::LexNumberXFractional(TokenDetail *detail,
                                    bool integer_part, bool point,
                                    const std::function<bool (int)> &is_number_char,
                                    const std::function<bool (int)> &is_exponent)
    {
        bool fractional_part = false;
        while (is_number_char(current_))
        {
            token_buffer_.push_back(current_);
            current_ = Next();
            fractional_part = true;
        }

        if (point && !integer_part && !fractional_part)
            throw LexException(module_->GetCStr(), line_, column_,
                    "unexpect '.'");
        else if (!point && !integer_part && !fractional_part)
            throw LexException(module_->GetCStr(), line_, column_,
                    "unexpect incomplete number '", token_buffer_, "'");

        if (is_exponent(current_))
        {
            token_buffer_.push_back(current_);
            current_ = Next();
            if (current_ == '-' || current_ == '+')
            {
                token_buffer_.push_back(current_);
                current_ = Next();
            }

            if (!isdigit(current_))
                throw LexException(module_->GetCStr(), line_, column_,
                        "expect exponent after '", token_buffer_, "'");

            while (isdigit(current_))
            {
                token_buffer_.push_back(current_);
                current_ = Next();
            }
        }

        double number = strtod(token_buffer_.c_str(), nullptr);
        RETURN_NUMBER_TOKEN_DETAIL(detail, number);
    }